

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
fetchRGBToRGB32F<(QImage::Format)11>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  uint rgb;
  ulong uVar1;
  QRgbaFloat<float> QVar2;
  
  uVar1 = 0;
  if (count < 1) {
    count = 0;
  }
  for (; (uint)(count * 2) != uVar1; uVar1 = uVar1 + 2) {
    rgb = convertPixelToRGB32<(QImage::Format)11>((uint)*(ushort *)(src + uVar1 + (long)index * 2));
    QVar2 = QRgbaFloat<float>::fromArgb32(rgb);
    *(QRgbaFloat<float> *)(&buffer->r + uVar1 * 2) = QVar2;
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGBToRGB32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32F<Format>(fetchPixel<bitsPerPixel<Format>()>(src, index + i));
    return buffer;
}